

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trapezoidal_decomposition.cc
# Opt level: O3

void __thiscall
PolygonTriangulation::compute_offset_vertex
          (PolygonTriangulation *this,uint32_t max_y_index,uint32_t min_y_index,vertex_t *offset)

{
  vertex_t *pvVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  pvVar1 = this->vertices_;
  dVar2 = pvVar1[min_y_index].x - pvVar1[max_y_index].x;
  offset->x = dVar2;
  dVar3 = pvVar1[min_y_index].y - pvVar1[max_y_index].y;
  dVar4 = (1.0 / SQRT(dVar2 * dVar2 + dVar3 * dVar3)) * 0.001;
  dVar2 = dVar2 * dVar4;
  offset->x = dVar2;
  dVar4 = dVar4 * dVar3;
  offset->y = dVar4;
  offset->x = dVar2 + pvVar1[max_y_index].x;
  offset->y = dVar4 + pvVar1[max_y_index].y;
  return;
}

Assistant:

void PolygonTriangulation::compute_offset_vertex(
    const uint32_t max_y_index,
    const uint32_t min_y_index,
    vertex_t &offset
) const {
  const auto eps = 1.0e-3;

  const auto &A = vertices_[max_y_index];
  const auto &B = vertices_[min_y_index];
  offset.x = B.x - A.x;
  offset.y = B.y - A.y;
  const auto invlen = 1.0 / sqrt(offset.x*offset.x + offset.y*offset.y);
  offset.x *= invlen * eps;
  offset.y *= invlen * eps;

  offset.x = A.x + offset.x;
  offset.y = A.y + offset.y;
}